

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_cnttzw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i32 ret;
  TCGv_i32 t;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  uVar1 = rS(ctx->opcode);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar1]);
  tcg_gen_ctzi_i32_ppc64(tcg_ctx_00,ret,ret,0x20);
  uVar1 = rA(ctx->opcode);
  tcg_gen_extu_i32_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],ret);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rA(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_cnttzw(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_trunc_tl_i32(tcg_ctx, t, cpu_gpr[rS(ctx->opcode)]);
    tcg_gen_ctzi_i32(tcg_ctx, t, t, 32);
    tcg_gen_extu_i32_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t);
    tcg_temp_free_i32(tcg_ctx, t);

    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}